

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O1

void asn1_encoding_clear(ASN1_ENCODING *enc)

{
  if (enc->buf == (CRYPTO_BUFFER *)0x0) {
    OPENSSL_free(enc->enc);
  }
  else {
    CRYPTO_BUFFER_free(enc->buf);
  }
  enc->enc = (uint8_t *)0x0;
  enc->len = 0;
  enc->buf = (CRYPTO_BUFFER *)0x0;
  return;
}

Assistant:

void asn1_encoding_clear(ASN1_ENCODING *enc) {
  if (enc->buf != NULL) {
    CRYPTO_BUFFER_free(enc->buf);
  } else {
    OPENSSL_free(enc->enc);
  }
  enc->enc = NULL;
  enc->len = 0;
  enc->buf = NULL;
}